

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_file_bag.c
# Opt level: O1

ion_err_t lfb_put(ion_lfb_t *bag,ion_byte_t *to_write,uint num_bytes,ion_file_offset_t next,
                 ion_file_offset_t *wrote_at)

{
  ion_err_t iVar1;
  ion_file_offset_t offset;
  ion_file_offset_t next_empty;
  ion_file_offset_t local_30;
  ion_file_offset_t local_28;
  
  local_30 = -1;
  local_28 = next;
  if (bag->next_empty == -1) {
    offset = ion_fend(bag->file_handle);
  }
  else {
    iVar1 = ion_fread_at(bag->file_handle,bag->next_empty,8,(ion_byte_t *)&local_30);
    if (iVar1 != '\0') {
      return iVar1;
    }
    offset = bag->next_empty;
  }
  *wrote_at = offset;
  iVar1 = ion_fwrite_at(bag->file_handle,offset,8,(ion_byte_t *)&local_28);
  if ((iVar1 == '\0') &&
     (iVar1 = ion_fwrite_at(bag->file_handle,*wrote_at + 8,num_bytes,to_write), iVar1 == '\0')) {
    bag->next_empty = local_30;
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
lfb_put(
	ion_lfb_t			*bag,
	ion_byte_t			*to_write,
	unsigned int		num_bytes,
	ion_file_offset_t	next,
	ion_file_offset_t	*wrote_at
) {
	ion_file_offset_t	next_empty;
	ion_err_t			error;

	next_empty = ION_LFB_NULL;

	if (ION_LFB_NULL != bag->next_empty) {
		error = ion_fread_at(bag->file_handle, bag->next_empty, sizeof(ion_file_offset_t), (ion_byte_t *) &next_empty);

		if (err_ok != error) {
			return error;
		}

		*wrote_at = bag->next_empty;
	}
	else {
		*wrote_at = ion_fend(bag->file_handle);
	}

	error = ion_fwrite_at(bag->file_handle, *wrote_at, sizeof(ion_file_offset_t), (ion_byte_t *) &next);

	if (err_ok != error) {
		return error;
	}

	error = ion_fwrite_at(bag->file_handle, *wrote_at + sizeof(ion_file_offset_t), num_bytes, to_write);

	if (err_ok != error) {
		return error;
	}

	bag->next_empty = next_empty;

	return err_ok;
}